

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_internal_defs.hpp
# Opt level: O1

string * iutest::detail::GetTypeNameProxy<iutest::Types<int,float>>::GetTypeName_abi_cxx11_(void)

{
  char *__ptr;
  string *str;
  string *in_RDI;
  char *__s;
  int status;
  allocator<char> local_25;
  int local_24;
  
  local_24 = 1;
  __ptr = (char *)__cxa_demangle("N6iutest5TypesIJifEEE",0,0,&local_24);
  __s = "N6iutest5TypesIJifEEE";
  if (local_24 == 0) {
    __s = __ptr;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,__s,&local_25);
  free(__ptr);
  return in_RDI;
}

Assistant:

static ::std::string    GetTypeName() { return detail::GetTypeName<T>(); }